

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to8.h
# Opt level: O0

void ncnn::deconvolution_pack16to8_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  long *plVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  int iVar114;
  int iVar115;
  undefined8 *puVar116;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _wf;
  __m256 _we;
  __m256 _wd;
  __m256 _wc;
  __m256 _wb;
  __m256 _wa;
  __m256 _w9;
  __m256 _w8;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _valf;
  __m256 _vale;
  __m256 _vald;
  __m256 _valc;
  __m256 _valb;
  __m256 _vala;
  __m256 _val9;
  __m256 _val8;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  undefined8 local_5640;
  undefined8 uStack_5638;
  int local_4b90;
  int local_4b84;
  int local_4b34;
  long local_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  int local_4aac;
  int local_4aa8;
  undefined1 (*local_4a38) [32];
  int local_4a2c;
  undefined1 local_3c00 [8];
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  float local_3700;
  float fStack_36fc;
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  float local_3660;
  float fStack_365c;
  float fStack_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  float fStack_3648;
  float fStack_3644;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float fStack_3610;
  float fStack_360c;
  float fStack_3608;
  undefined4 uStack_3604;
  float local_3600;
  float fStack_35fc;
  float fStack_35f8;
  float fStack_35f4;
  float local_35e0;
  float fStack_35dc;
  float fStack_35d8;
  float fStack_35d4;
  float fStack_35d0;
  float fStack_35cc;
  float fStack_35c8;
  undefined4 uStack_35c4;
  float local_35c0;
  float fStack_35bc;
  float fStack_35b8;
  float fStack_35b4;
  float fStack_35b0;
  float fStack_35ac;
  float fStack_35a8;
  float local_35a0;
  float fStack_359c;
  float fStack_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  float fStack_3588;
  float fStack_3584;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined1 local_3320 [16];
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined1 local_32c0 [16];
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined1 local_3280 [8];
  float fStack_3278;
  float fStack_3274;
  undefined1 local_3260 [16];
  float local_3180;
  float fStack_317c;
  float fStack_3178;
  float fStack_3174;
  float fStack_3170;
  float fStack_316c;
  float fStack_3168;
  float fStack_3164;
  float local_3160;
  float fStack_315c;
  float fStack_3158;
  float fStack_3154;
  float fStack_3150;
  float fStack_314c;
  float fStack_3148;
  float local_3100;
  float fStack_30fc;
  float fStack_30f8;
  float fStack_30f4;
  undefined1 local_30c0 [16];
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined1 local_3060 [16];
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined1 local_3020 [8];
  float fStack_3018;
  float fStack_3014;
  float local_2f20;
  float fStack_2f1c;
  float fStack_2f18;
  float fStack_2f14;
  float local_2f00;
  float fStack_2efc;
  float fStack_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float local_2080;
  float fStack_207c;
  float fStack_2078;
  float fStack_2074;
  float fStack_2070;
  float fStack_206c;
  float fStack_2068;
  float fStack_2064;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float fStack_1be8;
  float fStack_1be4;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined1 local_19e0 [16];
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined1 local_1980 [16];
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined1 local_1940 [8];
  float fStack_1938;
  float fStack_1934;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 local_ee0 [16];
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined1 local_e60 [8];
  float fStack_e58;
  float fStack_e54;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 local_de0 [8];
  float fStack_dd8;
  float fStack_dd4;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  
  lVar110 = in_RSI[7];
  lVar6 = *in_RCX;
  for (local_4a2c = 0; local_4a2c < (int)lVar110; local_4a2c = local_4a2c + 1) {
    local_4a38 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_4a2c * in_RSI[2]);
    iVar4 = *(int *)((long)in_RDI + 0x2c);
    lVar111 = in_RDI[6];
    lVar112 = in_RDI[7];
    iVar5 = *(int *)((long)in_RSI + 0x2c);
    lVar113 = in_RSI[6];
    for (local_4aa8 = 0; local_4aa8 < (int)lVar113; local_4aa8 = local_4aa8 + 1) {
      for (local_4aac = 0; local_4aac < iVar5; local_4aac = local_4aac + 1) {
        local_4ae0 = 0;
        uStack_4ad8 = 0;
        uStack_4ad0 = 0;
        uStack_4ac8 = 0;
        if (lVar6 != 0) {
          puVar116 = (undefined8 *)(lVar6 + (long)(local_4a2c << 3) * 4);
          local_4ae0 = *puVar116;
          uStack_4ad8 = puVar116[1];
          uStack_4ad0 = puVar116[2];
          uStack_4ac8 = puVar116[3];
        }
        local_4ae8 = *in_RDX + in_RDX[8] * (long)local_4a2c * in_RDX[2];
        for (local_4b34 = 0; local_4b34 < (int)lVar112; local_4b34 = local_4b34 + 1) {
          for (local_4b84 = 0; local_4b84 < in_R9D; local_4b84 = local_4b84 + 1) {
            iVar114 = (local_4aa8 + local_4b84 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar114) && (iVar114 % stride_w == 0)) && (iVar114 / stride_w < (int)lVar111)
               ) {
              for (local_4b90 = 0; local_4b90 < in_R8D; local_4b90 = local_4b90 + 1) {
                iVar115 = (local_4aac + local_4b90 * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar115) && (iVar115 % dilation_h == 0)) &&
                   (iVar115 / dilation_h < iVar4)) {
                  puVar1 = (undefined4 *)
                           (*in_RDI + in_RDI[8] * (long)local_4b34 * in_RDI[2] +
                            (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar114 / stride_w) *
                            in_RDI[2] + (long)(iVar115 / dilation_h << 4) * 4);
                  iVar115 = (local_4b84 * in_R8D + local_4b90) * 0x80;
                  uVar2 = *puVar1;
                  auVar25._4_4_ = uVar2;
                  auVar25._0_4_ = uVar2;
                  auVar25._12_4_ = uVar2;
                  auVar25._8_4_ = uVar2;
                  auVar25._20_4_ = uVar2;
                  auVar25._16_4_ = uVar2;
                  auVar25._28_4_ = uVar2;
                  auVar25._24_4_ = uVar2;
                  uVar2 = puVar1[1];
                  auVar23._4_4_ = uVar2;
                  auVar23._0_4_ = uVar2;
                  auVar23._12_4_ = uVar2;
                  auVar23._8_4_ = uVar2;
                  auVar23._20_4_ = uVar2;
                  auVar23._16_4_ = uVar2;
                  auVar23._28_4_ = uVar2;
                  auVar23._24_4_ = uVar2;
                  uVar2 = puVar1[2];
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._20_4_ = uVar2;
                  auVar22._16_4_ = uVar2;
                  auVar22._28_4_ = uVar2;
                  auVar22._24_4_ = uVar2;
                  uVar2 = puVar1[3];
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  auVar21._20_4_ = uVar2;
                  auVar21._16_4_ = uVar2;
                  auVar21._28_4_ = uVar2;
                  auVar21._24_4_ = uVar2;
                  uVar2 = puVar1[4];
                  auVar20._4_4_ = uVar2;
                  auVar20._0_4_ = uVar2;
                  auVar20._12_4_ = uVar2;
                  auVar20._8_4_ = uVar2;
                  auVar20._20_4_ = uVar2;
                  auVar20._16_4_ = uVar2;
                  auVar20._28_4_ = uVar2;
                  auVar20._24_4_ = uVar2;
                  uVar2 = puVar1[5];
                  auVar19._4_4_ = uVar2;
                  auVar19._0_4_ = uVar2;
                  auVar19._12_4_ = uVar2;
                  auVar19._8_4_ = uVar2;
                  auVar19._20_4_ = uVar2;
                  auVar19._16_4_ = uVar2;
                  auVar19._28_4_ = uVar2;
                  auVar19._24_4_ = uVar2;
                  uVar2 = puVar1[6];
                  auVar18._4_4_ = uVar2;
                  auVar18._0_4_ = uVar2;
                  auVar18._12_4_ = uVar2;
                  auVar18._8_4_ = uVar2;
                  auVar18._20_4_ = uVar2;
                  auVar18._16_4_ = uVar2;
                  auVar18._28_4_ = uVar2;
                  auVar18._24_4_ = uVar2;
                  uVar2 = puVar1[7];
                  auVar17._4_4_ = uVar2;
                  auVar17._0_4_ = uVar2;
                  auVar17._12_4_ = uVar2;
                  auVar17._8_4_ = uVar2;
                  auVar17._20_4_ = uVar2;
                  auVar17._16_4_ = uVar2;
                  auVar17._28_4_ = uVar2;
                  auVar17._24_4_ = uVar2;
                  uVar2 = puVar1[8];
                  auVar16._4_4_ = uVar2;
                  auVar16._0_4_ = uVar2;
                  auVar16._12_4_ = uVar2;
                  auVar16._8_4_ = uVar2;
                  auVar16._20_4_ = uVar2;
                  auVar16._16_4_ = uVar2;
                  auVar16._28_4_ = uVar2;
                  auVar16._24_4_ = uVar2;
                  uVar2 = puVar1[9];
                  auVar15._4_4_ = uVar2;
                  auVar15._0_4_ = uVar2;
                  auVar15._12_4_ = uVar2;
                  auVar15._8_4_ = uVar2;
                  auVar15._20_4_ = uVar2;
                  auVar15._16_4_ = uVar2;
                  auVar15._28_4_ = uVar2;
                  auVar15._24_4_ = uVar2;
                  uVar2 = puVar1[10];
                  auVar14._4_4_ = uVar2;
                  auVar14._0_4_ = uVar2;
                  auVar14._12_4_ = uVar2;
                  auVar14._8_4_ = uVar2;
                  auVar14._20_4_ = uVar2;
                  auVar14._16_4_ = uVar2;
                  auVar14._28_4_ = uVar2;
                  auVar14._24_4_ = uVar2;
                  uVar2 = puVar1[0xb];
                  auVar120._4_4_ = uVar2;
                  auVar120._0_4_ = uVar2;
                  auVar120._12_4_ = uVar2;
                  auVar120._8_4_ = uVar2;
                  auVar120._20_4_ = uVar2;
                  auVar120._16_4_ = uVar2;
                  auVar120._28_4_ = uVar2;
                  auVar120._24_4_ = uVar2;
                  uVar2 = puVar1[0xc];
                  auVar119._4_4_ = uVar2;
                  auVar119._0_4_ = uVar2;
                  auVar119._12_4_ = uVar2;
                  auVar119._8_4_ = uVar2;
                  auVar119._20_4_ = uVar2;
                  auVar119._16_4_ = uVar2;
                  auVar119._28_4_ = uVar2;
                  auVar119._24_4_ = uVar2;
                  uVar2 = puVar1[0xd];
                  auVar118._4_4_ = uVar2;
                  auVar118._0_4_ = uVar2;
                  auVar118._12_4_ = uVar2;
                  auVar118._8_4_ = uVar2;
                  auVar118._20_4_ = uVar2;
                  auVar118._16_4_ = uVar2;
                  auVar118._28_4_ = uVar2;
                  auVar118._24_4_ = uVar2;
                  uVar2 = puVar1[0xe];
                  auVar117._4_4_ = uVar2;
                  auVar117._0_4_ = uVar2;
                  auVar117._12_4_ = uVar2;
                  auVar117._8_4_ = uVar2;
                  auVar117._20_4_ = uVar2;
                  auVar117._16_4_ = uVar2;
                  auVar117._28_4_ = uVar2;
                  auVar117._24_4_ = uVar2;
                  uVar2 = puVar1[0xf];
                  auVar121._4_4_ = uVar2;
                  auVar121._0_4_ = uVar2;
                  auVar121._12_4_ = uVar2;
                  auVar121._8_4_ = uVar2;
                  auVar121._20_4_ = uVar2;
                  auVar121._16_4_ = uVar2;
                  auVar121._28_4_ = uVar2;
                  auVar121._24_4_ = uVar2;
                  auVar24._8_8_ = uStack_4ad8;
                  auVar24._0_8_ = local_4ae0;
                  auVar24._16_8_ = uStack_4ad0;
                  auVar24._24_8_ = uStack_4ac8;
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])(local_4ae8 + (long)iVar115 * 4),
                                            auVar25,auVar24);
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x20),auVar23,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x40),auVar22,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x60),auVar21,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x80),auVar20,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0xa0),auVar19,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0xc0),auVar18,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0xe0),auVar17,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x100),auVar16,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x120),auVar15,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x140),auVar14,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x160),auVar120,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x180),auVar119,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x1a0),auVar118,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x1c0),auVar117,
                                            ZEXT1632(auVar10));
                  auVar10 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                             (local_4ae8 + (long)iVar115 * 4 + 0x1e0),auVar121,
                                            ZEXT1632(auVar10));
                  local_5640 = auVar10._0_8_;
                  uStack_5638 = auVar10._8_8_;
                  local_4ae0 = local_5640;
                  uStack_4ad8 = uStack_5638;
                  uStack_4ad0 = 0;
                  uStack_4ac8 = 0;
                }
              }
            }
          }
          local_4ae8 = local_4ae8 + (long)(in_R8D * in_R9D * 0x80) * 4;
        }
        plVar13 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_35e0 = (float)local_4ae0;
        fStack_35dc = (float)((ulong)local_4ae0 >> 0x20);
        fStack_35d8 = (float)uStack_4ad8;
        fStack_35d4 = (float)((ulong)uStack_4ad8 >> 0x20);
        fStack_35d0 = (float)uStack_4ad0;
        fStack_35cc = (float)((ulong)uStack_4ad0 >> 0x20);
        fStack_35c8 = (float)uStack_4ac8;
        switch(stride_h) {
        case 1:
          auVar26._8_8_ = uStack_4ad8;
          auVar26._0_8_ = local_4ae0;
          auVar26._16_8_ = uStack_4ad0;
          auVar26._24_8_ = uStack_4ac8;
          _local_3c00 = vmaxps_avx(auVar26,ZEXT1632(ZEXT816(0)));
          break;
        case 2:
          uVar3 = *(uint *)*plVar13;
          auVar29._8_8_ = uStack_4ad8;
          auVar29._0_8_ = local_4ae0;
          auVar29._16_8_ = uStack_4ad0;
          auVar29._24_8_ = uStack_4ac8;
          auVar121 = vmaxps_avx(ZEXT1632(ZEXT816(0)),auVar29);
          auVar30._8_8_ = uStack_4ad8;
          auVar30._0_8_ = local_4ae0;
          auVar30._16_8_ = uStack_4ad0;
          auVar30._24_8_ = uStack_4ac8;
          auVar117 = vminps_avx(ZEXT1632(ZEXT816(0)),auVar30);
          auVar10 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x30);
          auVar7 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x30);
          local_35a0 = auVar7._0_4_;
          fStack_359c = auVar7._4_4_;
          fStack_3598 = auVar7._8_4_;
          fStack_3594 = auVar7._12_4_;
          fStack_3590 = auVar10._0_4_;
          fStack_358c = auVar10._4_4_;
          fStack_3588 = auVar10._8_4_;
          fStack_3584 = auVar10._12_4_;
          local_35c0 = auVar117._0_4_;
          fStack_35bc = auVar117._4_4_;
          fStack_35b8 = auVar117._8_4_;
          fStack_35b4 = auVar117._12_4_;
          fStack_35b0 = auVar117._16_4_;
          fStack_35ac = auVar117._20_4_;
          fStack_35a8 = auVar117._24_4_;
          local_3660 = auVar121._0_4_;
          fStack_365c = auVar121._4_4_;
          fStack_3658 = auVar121._8_4_;
          fStack_3654 = auVar121._12_4_;
          fStack_3650 = auVar121._16_4_;
          fStack_364c = auVar121._20_4_;
          fStack_3648 = auVar121._24_4_;
          fStack_3644 = auVar121._28_4_;
          local_3c00._4_4_ = fStack_365c + fStack_359c * fStack_35bc;
          local_3c00._0_4_ = local_3660 + local_35a0 * local_35c0;
          uStack_3bf8._0_4_ = fStack_3658 + fStack_3598 * fStack_35b8;
          uStack_3bf8._4_4_ = fStack_3654 + fStack_3594 * fStack_35b4;
          uStack_3bf0._0_4_ = fStack_3650 + fStack_3590 * fStack_35b0;
          uStack_3bf0._4_4_ = fStack_364c + fStack_358c * fStack_35ac;
          uStack_3be8._0_4_ = fStack_3648 + fStack_3588 * fStack_35a8;
          uStack_3be8._4_4_ = fStack_3644 + fStack_3584;
          break;
        case 3:
          uVar3 = *(uint *)*plVar13;
          auVar10 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x30);
          auVar7 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x30);
          uStack_3430 = auVar7._0_8_;
          uStack_3428 = auVar7._8_8_;
          uVar3 = *(uint *)(*plVar13 + 4);
          auVar7 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          uStack_33f0 = auVar7._0_8_;
          uStack_33e8 = auVar7._8_8_;
          auVar28._8_8_ = uStack_4ad8;
          auVar28._0_8_ = local_4ae0;
          auVar28._16_8_ = uStack_4ad0;
          auVar28._24_8_ = uStack_4ac8;
          auVar27._16_8_ = uStack_3430;
          auVar27._0_16_ = auVar10;
          auVar27._24_8_ = uStack_3428;
          auVar121 = vmaxps_avx(auVar28,auVar27);
          auVar31._16_8_ = uStack_33f0;
          auVar31._0_16_ = auVar8;
          auVar31._24_8_ = uStack_33e8;
          _local_3c00 = vminps_avx(auVar121,auVar31);
          break;
        case 4:
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
          uStack_34f0 = auVar7._0_8_;
          uStack_34e8 = auVar7._8_8_;
          auVar40._8_8_ = uStack_4ad8;
          auVar40._0_8_ = local_4ae0;
          auVar40._16_8_ = uStack_4ad0;
          auVar40._24_8_ = uStack_4ac8;
          auVar121 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar40);
          auVar39._8_4_ = 0x42b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar39._12_4_ = 0x42b0c0a5;
          auVar39._16_4_ = 0x42b0c0a5;
          auVar39._20_4_ = 0x42b0c0a5;
          auVar39._24_4_ = 0x42b0c0a5;
          auVar39._28_4_ = 0x42b0c0a5;
          auVar121 = vminps_avx(auVar121,auVar39);
          auVar38._8_4_ = 0xc2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._12_4_ = 0xc2b0c0a5;
          auVar38._16_4_ = 0xc2b0c0a5;
          auVar38._20_4_ = 0xc2b0c0a5;
          auVar38._24_4_ = 0xc2b0c0a5;
          auVar38._28_4_ = 0xc2b0c0a5;
          auVar117 = vmaxps_avx(auVar121,auVar38);
          auVar48._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar48._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar48._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar48._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar47._8_8_ = 0x3f0000003f000000;
          auVar47._0_8_ = 0x3f0000003f000000;
          auVar47._16_8_ = 0x3f0000003f000000;
          auVar47._24_8_ = 0x3f0000003f000000;
          auVar8 = vfmadd213ps_fma(auVar48,auVar117,auVar47);
          auVar118 = vroundps_avx(ZEXT1632(auVar8),1);
          auVar121 = vcmpps_avx(ZEXT1632(auVar8),auVar118,1);
          auVar60._8_8_ = 0x3f8000003f800000;
          auVar60._0_8_ = 0x3f8000003f800000;
          auVar60._16_8_ = 0x3f8000003f800000;
          auVar60._24_8_ = 0x3f8000003f800000;
          auVar121 = vpand_avx2(auVar121,auVar60);
          auVar121 = vsubps_avx(auVar118,auVar121);
          auVar64._8_8_ = 0x3f3180003f318000;
          auVar64._0_8_ = 0x3f3180003f318000;
          auVar64._16_8_ = 0x3f3180003f318000;
          auVar64._24_8_ = 0x3f3180003f318000;
          auVar8 = vfnmadd213ps_fma(auVar64,auVar121,auVar117);
          auVar65._8_8_ = 0xb95e8083b95e8083;
          auVar65._0_8_ = 0xb95e8083b95e8083;
          auVar65._16_8_ = 0xb95e8083b95e8083;
          auVar65._24_8_ = 0xb95e8083b95e8083;
          auVar9 = vfnmadd213ps_fma(auVar65,auVar121,ZEXT1632(auVar8));
          local_2ea0 = auVar9._0_4_;
          fStack_2e9c = auVar9._4_4_;
          fStack_2e98 = auVar9._8_4_;
          fStack_2e94 = auVar9._12_4_;
          _local_3020 = CONCAT412(fStack_2e94 * fStack_2e94,
                                  CONCAT48(fStack_2e98 * fStack_2e98,
                                           CONCAT44(fStack_2e9c * fStack_2e9c,
                                                    local_2ea0 * local_2ea0)));
          local_30c0._8_4_ = 0x39506967;
          local_30c0._0_8_ = 0x3950696739506967;
          local_30c0._12_4_ = 0x39506967;
          uStack_30b0._0_4_ = 0x39506967;
          uStack_30b0._4_4_ = 0x39506967;
          uStack_30a8._0_4_ = 0x39506967;
          uStack_30a8._4_4_ = 0x39506967;
          auVar117 = _local_30c0;
          uStack_30a8 = auVar117._24_8_;
          auVar46._16_8_ = uStack_30b0;
          auVar46._0_16_ = local_30c0;
          auVar46._24_8_ = uStack_30a8;
          auVar45._8_8_ = 0x3ab743ce3ab743ce;
          auVar45._0_8_ = 0x3ab743ce3ab743ce;
          auVar45._16_8_ = 0x3ab743ce3ab743ce;
          auVar45._24_8_ = 0x3ab743ce3ab743ce;
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar46,auVar45);
          auVar44._8_8_ = 0x3c0889083c088908;
          auVar44._0_8_ = 0x3c0889083c088908;
          auVar44._16_8_ = 0x3c0889083c088908;
          auVar44._24_8_ = 0x3c0889083c088908;
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar44);
          auVar43._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar43);
          auVar42._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar42._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar42._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar42._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar42);
          auVar41._8_8_ = 0x3f0000003f000000;
          auVar41._0_8_ = 0x3f0000003f000000;
          auVar41._16_8_ = 0x3f0000003f000000;
          auVar41._24_8_ = 0x3f0000003f000000;
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar41);
          auVar8 = vfmadd213ps_fma(ZEXT1632(_local_3020),ZEXT1632(auVar8),ZEXT1632(auVar9));
          local_2f20 = auVar8._0_4_;
          fStack_2f1c = auVar8._4_4_;
          fStack_2f18 = auVar8._8_4_;
          fStack_2f14 = auVar8._12_4_;
          local_2080 = auVar121._0_4_;
          fStack_207c = auVar121._4_4_;
          fStack_2078 = auVar121._8_4_;
          fStack_2074 = auVar121._12_4_;
          fStack_2070 = auVar121._16_4_;
          fStack_206c = auVar121._20_4_;
          fStack_2068 = auVar121._24_4_;
          fStack_2064 = auVar121._28_4_;
          local_3060._4_4_ = (int)fStack_207c;
          local_3060._0_4_ = (int)local_2080;
          local_3060._8_4_ = (int)fStack_2078;
          local_3060._12_4_ = (int)fStack_2074;
          uStack_3050._0_4_ = (int)fStack_2070;
          uStack_3050._4_4_ = (int)fStack_206c;
          uStack_3048._0_4_ = (int)fStack_2068;
          uStack_3048._4_4_ = (int)fStack_2064;
          auVar121 = _local_3060;
          uStack_3048 = auVar121._24_8_;
          auVar69._16_8_ = uStack_3050;
          auVar69._0_16_ = local_3060;
          auVar69._24_8_ = uStack_3048;
          auVar68._8_8_ = 0x7f0000007f;
          auVar68._0_8_ = 0x7f0000007f;
          auVar68._16_8_ = 0x7f0000007f;
          auVar68._24_8_ = 0x7f0000007f;
          auVar121 = vpaddd_avx2(auVar69,auVar68);
          auVar121 = vpslld_avx2(auVar121,ZEXT416(0x17));
          local_2f00 = auVar121._0_4_;
          fStack_2efc = auVar121._4_4_;
          fStack_2ef8 = auVar121._8_4_;
          fStack_2ef4 = auVar121._12_4_;
          fStack_2ef0 = auVar121._16_4_;
          fStack_2eec = auVar121._20_4_;
          fStack_2ee8 = auVar121._24_4_;
          local_36a0 = auVar10._0_4_;
          fStack_369c = auVar10._4_4_;
          fStack_3698 = auVar10._8_4_;
          fStack_3694 = auVar10._12_4_;
          fStack_3690 = auVar7._0_4_;
          fStack_368c = auVar7._4_4_;
          fStack_3688 = auVar7._8_4_;
          fStack_3684 = auVar7._12_4_;
          auVar34._16_8_ = uStack_34f0;
          auVar34._0_16_ = auVar10;
          auVar34._24_8_ = uStack_34e8;
          auVar33._4_4_ = fStack_369c + (fStack_2f1c + 1.0) * fStack_2efc;
          auVar33._0_4_ = local_36a0 + (local_2f20 + 1.0) * local_2f00;
          auVar33._8_4_ = fStack_3698 + (fStack_2f18 + 1.0) * fStack_2ef8;
          auVar33._12_4_ = fStack_3694 + (fStack_2f14 + 1.0) * fStack_2ef4;
          auVar33._16_4_ = fStack_3690 + fStack_2ef0 * 1.0;
          auVar33._20_4_ = fStack_368c + fStack_2eec * 1.0;
          auVar33._24_4_ = fStack_3688 + fStack_2ee8 * 1.0;
          auVar33._28_4_ = fStack_3684 + 1.0;
          _local_3c00 = vdivps_avx(auVar34,auVar33);
          break;
        case 5:
          local_3260._8_8_ = uStack_4ad8;
          local_3260._0_8_ = local_4ae0;
          auVar37._16_8_ = uStack_4ad0;
          auVar37._0_16_ = local_3260;
          auVar37._24_8_ = uStack_4ac8;
          auVar36._8_4_ = 0x42b0c0a5;
          auVar36._0_8_ = 0x42b0c0a542b0c0a5;
          auVar36._12_4_ = 0x42b0c0a5;
          auVar36._16_4_ = 0x42b0c0a5;
          auVar36._20_4_ = 0x42b0c0a5;
          auVar36._24_4_ = 0x42b0c0a5;
          auVar36._28_4_ = 0x42b0c0a5;
          auVar121 = vminps_avx(auVar37,auVar36);
          auVar35._8_4_ = 0xc2b0c0a5;
          auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar35._12_4_ = 0xc2b0c0a5;
          auVar35._16_4_ = 0xc2b0c0a5;
          auVar35._20_4_ = 0xc2b0c0a5;
          auVar35._24_4_ = 0xc2b0c0a5;
          auVar35._28_4_ = 0xc2b0c0a5;
          auVar117 = vmaxps_avx(auVar121,auVar35);
          auVar56._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar56._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar56._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar56._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar55._8_8_ = 0x3f0000003f000000;
          auVar55._0_8_ = 0x3f0000003f000000;
          auVar55._16_8_ = 0x3f0000003f000000;
          auVar55._24_8_ = 0x3f0000003f000000;
          auVar10 = vfmadd213ps_fma(auVar56,auVar117,auVar55);
          auVar118 = vroundps_avx(ZEXT1632(auVar10),1);
          auVar121 = vcmpps_avx(ZEXT1632(auVar10),auVar118,1);
          auVar61._8_8_ = 0x3f8000003f800000;
          auVar61._0_8_ = 0x3f8000003f800000;
          auVar61._16_8_ = 0x3f8000003f800000;
          auVar61._24_8_ = 0x3f8000003f800000;
          auVar121 = vpand_avx2(auVar121,auVar61);
          auVar121 = vsubps_avx(auVar118,auVar121);
          auVar62._8_8_ = 0x3f3180003f318000;
          auVar62._0_8_ = 0x3f3180003f318000;
          auVar62._16_8_ = 0x3f3180003f318000;
          auVar62._24_8_ = 0x3f3180003f318000;
          auVar10 = vfnmadd213ps_fma(auVar62,auVar121,auVar117);
          auVar63._8_8_ = 0xb95e8083b95e8083;
          auVar63._0_8_ = 0xb95e8083b95e8083;
          auVar63._16_8_ = 0xb95e8083b95e8083;
          auVar63._24_8_ = 0xb95e8083b95e8083;
          auVar7 = vfnmadd213ps_fma(auVar63,auVar121,ZEXT1632(auVar10));
          local_3100 = auVar7._0_4_;
          fStack_30fc = auVar7._4_4_;
          fStack_30f8 = auVar7._8_4_;
          fStack_30f4 = auVar7._12_4_;
          _local_3280 = CONCAT412(fStack_30f4 * fStack_30f4,
                                  CONCAT48(fStack_30f8 * fStack_30f8,
                                           CONCAT44(fStack_30fc * fStack_30fc,
                                                    local_3100 * local_3100)));
          local_3320._8_4_ = 0x39506967;
          local_3320._0_8_ = 0x3950696739506967;
          local_3320._12_4_ = 0x39506967;
          uStack_3310._0_4_ = 0x39506967;
          uStack_3310._4_4_ = 0x39506967;
          uStack_3308._0_4_ = 0x39506967;
          uStack_3308._4_4_ = 0x39506967;
          auVar117 = _local_3320;
          uStack_3308 = auVar117._24_8_;
          auVar54._16_8_ = uStack_3310;
          auVar54._0_16_ = local_3320;
          auVar54._24_8_ = uStack_3308;
          auVar53._8_8_ = 0x3ab743ce3ab743ce;
          auVar53._0_8_ = 0x3ab743ce3ab743ce;
          auVar53._16_8_ = 0x3ab743ce3ab743ce;
          auVar53._24_8_ = 0x3ab743ce3ab743ce;
          auVar10 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar54,auVar53);
          auVar52._8_8_ = 0x3c0889083c088908;
          auVar52._0_8_ = 0x3c0889083c088908;
          auVar52._16_8_ = 0x3c0889083c088908;
          auVar52._24_8_ = 0x3c0889083c088908;
          auVar10 = vfmadd213ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar10),auVar52);
          auVar51._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar10 = vfmadd213ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar10),auVar51);
          auVar50._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar117 = vfmadd213ps_avx512vl(ZEXT1632(auVar7),ZEXT1632(auVar10),auVar50);
          auVar49._8_8_ = 0x3f0000003f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar49._16_8_ = 0x3f0000003f000000;
          auVar49._24_8_ = 0x3f0000003f000000;
          auVar117 = vfmadd213ps_avx512vl(ZEXT1632(auVar7),auVar117,auVar49);
          auVar117 = vfmadd213ps_avx512vl(ZEXT1632(_local_3280),auVar117,ZEXT1632(auVar7));
          local_3180 = auVar117._0_4_;
          fStack_317c = auVar117._4_4_;
          fStack_3178 = auVar117._8_4_;
          fStack_3174 = auVar117._12_4_;
          fStack_3170 = auVar117._16_4_;
          fStack_316c = auVar117._20_4_;
          fStack_3168 = auVar117._24_4_;
          fStack_3164 = auVar117._28_4_;
          local_2060 = auVar121._0_4_;
          fStack_205c = auVar121._4_4_;
          fStack_2058 = auVar121._8_4_;
          fStack_2054 = auVar121._12_4_;
          fStack_2050 = auVar121._16_4_;
          fStack_204c = auVar121._20_4_;
          fStack_2048 = auVar121._24_4_;
          fStack_2044 = auVar121._28_4_;
          local_32c0._4_4_ = (int)fStack_205c;
          local_32c0._0_4_ = (int)local_2060;
          local_32c0._8_4_ = (int)fStack_2058;
          local_32c0._12_4_ = (int)fStack_2054;
          uStack_32b0._0_4_ = (int)fStack_2050;
          uStack_32b0._4_4_ = (int)fStack_204c;
          uStack_32a8._0_4_ = (int)fStack_2048;
          uStack_32a8._4_4_ = (int)fStack_2044;
          auVar121 = _local_32c0;
          uStack_32a8 = auVar121._24_8_;
          auVar67._16_8_ = uStack_32b0;
          auVar67._0_16_ = local_32c0;
          auVar67._24_8_ = uStack_32a8;
          auVar66._8_8_ = 0x7f0000007f;
          auVar66._0_8_ = 0x7f0000007f;
          auVar66._16_8_ = 0x7f0000007f;
          auVar66._24_8_ = 0x7f0000007f;
          auVar121 = vpaddd_avx2(auVar67,auVar66);
          auVar121 = vpslld_avx2(auVar121,ZEXT416(0x17));
          local_3160 = auVar121._0_4_;
          fStack_315c = auVar121._4_4_;
          fStack_3158 = auVar121._8_4_;
          fStack_3154 = auVar121._12_4_;
          fStack_3150 = auVar121._16_4_;
          fStack_314c = auVar121._20_4_;
          fStack_3148 = auVar121._24_4_;
          auVar10 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx512f(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx512f(auVar10,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x3f800000),0x30);
          local_3700 = auVar10._0_4_;
          fStack_36fc = auVar10._4_4_;
          fStack_36f8 = auVar10._8_4_;
          fStack_36f4 = auVar10._12_4_;
          fStack_36f0 = auVar7._0_4_;
          fStack_36ec = auVar7._4_4_;
          fStack_36e8 = auVar7._8_4_;
          fStack_36e4 = auVar7._12_4_;
          local_de0._4_4_ = (fStack_317c + 1.0) * fStack_315c + fStack_36fc;
          local_de0._0_4_ = (local_3180 + 1.0) * local_3160 + local_3700;
          fStack_dd8 = (fStack_3178 + 1.0) * fStack_3158 + fStack_36f8;
          fStack_dd4 = (fStack_3174 + 1.0) * fStack_3154 + fStack_36f4;
          uStack_dd0._0_4_ = (fStack_3170 + 1.0) * fStack_3150 + fStack_36f0;
          uStack_dd0._4_4_ = (fStack_316c + 1.0) * fStack_314c + fStack_36ec;
          uStack_dc8._0_4_ = (fStack_3168 + 1.0) * fStack_3148 + fStack_36e8;
          uStack_dc8._4_4_ = fStack_3164 + 1.0 + fStack_36e4;
          auVar117 = _local_de0;
          auVar121 = vcmpps_avx(_local_de0,ZEXT1632(ZEXT816(0)),2);
          uStack_dc8 = auVar117._24_8_;
          auVar89._16_8_ = uStack_dd0;
          auVar89._0_16_ = _local_de0;
          auVar89._24_8_ = uStack_dc8;
          auVar88._8_4_ = 0x800000;
          auVar88._0_8_ = 0x80000000800000;
          auVar88._12_4_ = 0x800000;
          auVar88._16_4_ = 0x800000;
          auVar88._20_4_ = 0x800000;
          auVar88._24_4_ = 0x800000;
          auVar88._28_4_ = 0x800000;
          auVar117 = vmaxps_avx512vl(auVar89,auVar88);
          auVar118 = vpsrld_avx512vl(auVar117,ZEXT416(0x17));
          auVar104._8_4_ = 0x807fffff;
          auVar104._0_8_ = 0x807fffff807fffff;
          auVar104._12_4_ = 0x807fffff;
          auVar104._16_4_ = 0x807fffff;
          auVar104._20_4_ = 0x807fffff;
          auVar104._24_4_ = 0x807fffff;
          auVar104._28_4_ = 0x807fffff;
          auVar119 = vmovdqa64_avx512vl(auVar104);
          auVar117 = vpandd_avx512vl(auVar117,auVar119);
          auVar108._8_4_ = 0x3f000000;
          auVar108._0_8_ = 0x3f0000003f000000;
          auVar108._12_4_ = 0x3f000000;
          auVar108._16_4_ = 0x3f000000;
          auVar108._20_4_ = 0x3f000000;
          auVar108._24_4_ = 0x3f000000;
          auVar108._28_4_ = 0x3f000000;
          auVar119 = vmovdqa64_avx512vl(auVar108);
          auVar119 = vpord_avx512vl(auVar117,auVar119);
          auVar109._8_8_ = 0x7f0000007f;
          auVar109._0_8_ = 0x7f0000007f;
          auVar109._16_8_ = 0x7f0000007f;
          auVar109._24_8_ = 0x7f0000007f;
          auVar117 = vpsubd_avx2(auVar118,auVar109);
          auVar117 = vcvtdq2ps_avx(auVar117);
          local_cc0 = auVar117._0_4_;
          fStack_cbc = auVar117._4_4_;
          fStack_cb8 = auVar117._8_4_;
          fStack_cb4 = auVar117._12_4_;
          fStack_cb0 = auVar117._16_4_;
          fStack_cac = auVar117._20_4_;
          fStack_ca8 = auVar117._24_4_;
          fStack_ca4 = auVar117._28_4_;
          local_e60._4_4_ = fStack_cbc + 1.0;
          local_e60._0_4_ = local_cc0 + 1.0;
          fStack_e58 = fStack_cb8 + 1.0;
          fStack_e54 = fStack_cb4 + 1.0;
          uStack_e50._0_4_ = fStack_cb0 + 1.0;
          uStack_e50._4_4_ = fStack_cac + 1.0;
          uStack_e48._0_4_ = fStack_ca8 + 1.0;
          uStack_e48._4_4_ = fStack_ca4 + 1.0;
          auVar118 = _local_e60;
          auVar122._8_4_ = 0x3f3504f3;
          auVar122._0_8_ = 0x3f3504f33f3504f3;
          auVar122._12_4_ = 0x3f3504f3;
          auVar122._16_4_ = 0x3f3504f3;
          auVar122._20_4_ = 0x3f3504f3;
          auVar122._24_4_ = 0x3f3504f3;
          auVar122._28_4_ = 0x3f3504f3;
          auVar117 = vcmpps_avx(auVar119,auVar122,1);
          auVar120 = vmovdqa64_avx512vl(auVar117);
          auVar120 = vpandd_avx512vl(auVar119,auVar120);
          auVar91._8_8_ = 0x3f8000003f800000;
          auVar91._0_8_ = 0x3f8000003f800000;
          auVar91._16_8_ = 0x3f8000003f800000;
          auVar91._24_8_ = 0x3f8000003f800000;
          auVar119 = vsubps_avx512vl(auVar119,auVar91);
          uStack_e48 = auVar118._24_8_;
          auVar103._8_8_ = 0x3f8000003f800000;
          auVar103._0_8_ = 0x3f8000003f800000;
          auVar103._16_8_ = 0x3f8000003f800000;
          auVar103._24_8_ = 0x3f8000003f800000;
          auVar117 = vmovdqa64_avx512vl(auVar117);
          auVar117 = vpandd_avx512vl(auVar103,auVar117);
          auVar90._16_8_ = uStack_e50;
          auVar90._0_16_ = _local_e60;
          auVar90._24_8_ = uStack_e48;
          auVar118 = vsubps_avx512vl(auVar90,auVar117);
          auVar119 = vaddps_avx512vl(auVar119,auVar120);
          auVar120 = vmulps_avx512vl(auVar119,auVar119);
          local_ee0._8_4_ = 0x3d9021bb;
          local_ee0._0_8_ = 0x3d9021bb3d9021bb;
          local_ee0._12_4_ = 0x3d9021bb;
          uStack_ed0._0_4_ = 0x3d9021bb;
          uStack_ed0._4_4_ = 0x3d9021bb;
          uStack_ec8._0_4_ = 0x3d9021bb;
          uStack_ec8._4_4_ = 0x3d9021bb;
          auVar117 = _local_ee0;
          uStack_ec8 = auVar117._24_8_;
          auVar102._16_8_ = uStack_ed0;
          auVar102._0_16_ = local_ee0;
          auVar102._24_8_ = uStack_ec8;
          auVar101._8_8_ = 0xbdebd1b8bdebd1b8;
          auVar101._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar101._16_8_ = 0xbdebd1b8bdebd1b8;
          auVar101._24_8_ = 0xbdebd1b8bdebd1b8;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar102,auVar101);
          auVar100._8_8_ = 0x3def251a3def251a;
          auVar100._0_8_ = 0x3def251a3def251a;
          auVar100._16_8_ = 0x3def251a3def251a;
          auVar100._24_8_ = 0x3def251a3def251a;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar100);
          auVar99._8_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar99._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar99._16_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar99._24_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar99);
          auVar98._8_8_ = 0x3e11e9bf3e11e9bf;
          auVar98._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar98._16_8_ = 0x3e11e9bf3e11e9bf;
          auVar98._24_8_ = 0x3e11e9bf3e11e9bf;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar98);
          auVar97._8_8_ = 0xbe2aae50be2aae50;
          auVar97._0_8_ = 0xbe2aae50be2aae50;
          auVar97._16_8_ = 0xbe2aae50be2aae50;
          auVar97._24_8_ = 0xbe2aae50be2aae50;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar97);
          auVar96._8_8_ = 0x3e4cceac3e4cceac;
          auVar96._0_8_ = 0x3e4cceac3e4cceac;
          auVar96._16_8_ = 0x3e4cceac3e4cceac;
          auVar96._24_8_ = 0x3e4cceac3e4cceac;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar96);
          auVar95._8_8_ = 0xbe7ffffcbe7ffffc;
          auVar95._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar95._16_8_ = 0xbe7ffffcbe7ffffc;
          auVar95._24_8_ = 0xbe7ffffcbe7ffffc;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar95);
          auVar94._8_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar94._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar94._16_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar94._24_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar117 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar94);
          auVar117 = vmulps_avx512vl(auVar117,auVar119);
          auVar117 = vmulps_avx512vl(auVar117,auVar120);
          auVar93._8_8_ = 0xb95e8083b95e8083;
          auVar93._0_8_ = 0xb95e8083b95e8083;
          auVar93._16_8_ = 0xb95e8083b95e8083;
          auVar93._24_8_ = 0xb95e8083b95e8083;
          auVar117 = vfmadd213ps_avx512vl(auVar93,auVar118,auVar117);
          auVar105._8_8_ = 0x3f0000003f000000;
          auVar105._0_8_ = 0x3f0000003f000000;
          auVar105._16_8_ = 0x3f0000003f000000;
          auVar105._24_8_ = 0x3f0000003f000000;
          auVar117 = vfnmadd213ps_avx512vl(auVar105,auVar120,auVar117);
          auVar117 = vaddps_avx512vl(auVar119,auVar117);
          auVar92._8_8_ = 0x3f3180003f318000;
          auVar92._0_8_ = 0x3f3180003f318000;
          auVar92._16_8_ = 0x3f3180003f318000;
          auVar92._24_8_ = 0x3f3180003f318000;
          auVar117 = vfmadd213ps_avx512vl(auVar92,auVar118,auVar117);
          auVar121 = vmovdqa64_avx512vl(auVar121);
          auVar121 = vpord_avx512vl(auVar117,auVar121);
          auVar10 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx512f(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx512f(auVar10,ZEXT416(0x3f800000),0x30);
          auVar7 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x3f800000),0x20);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x3f800000),0x30);
          uStack_1ab0 = auVar7._0_8_;
          uStack_1aa8 = auVar7._8_8_;
          auVar7 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x40000000),0x20);
          auVar7 = vinsertps_avx512f(auVar7,ZEXT416(0x40000000),0x30);
          auVar8 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar8 = vinsertps_avx512f(auVar8,ZEXT416(0x40000000),0x20);
          auVar8 = vinsertps_avx512f(auVar8,ZEXT416(0x40000000),0x30);
          uStack_1a70 = auVar8._0_8_;
          uStack_1a68 = auVar8._8_8_;
          auVar70._16_8_ = uStack_1a70;
          auVar70._0_16_ = auVar7;
          auVar70._24_8_ = uStack_1a68;
          auVar121 = vmulps_avx512vl(auVar121,auVar70);
          auVar8 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx512f(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx512f(auVar8,ZEXT416(0x3f800000),0x30);
          auVar9 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx512f(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx512f(auVar9,ZEXT416(0x3f800000),0x30);
          local_1c00 = auVar8._0_4_;
          fStack_1bfc = auVar8._4_4_;
          fStack_1bf8 = auVar8._8_4_;
          fStack_1bf4 = auVar8._12_4_;
          fStack_1bf0 = auVar9._0_4_;
          fStack_1bec = auVar9._4_4_;
          fStack_1be8 = auVar9._8_4_;
          fStack_1be4 = auVar9._12_4_;
          auVar121 = vsubps_avx512vl(ZEXT1632(ZEXT816(0)),auVar121);
          auVar74._8_4_ = 0x42b0c0a5;
          auVar74._0_8_ = 0x42b0c0a542b0c0a5;
          auVar74._12_4_ = 0x42b0c0a5;
          auVar74._16_4_ = 0x42b0c0a5;
          auVar74._20_4_ = 0x42b0c0a5;
          auVar74._24_4_ = 0x42b0c0a5;
          auVar74._28_4_ = 0x42b0c0a5;
          auVar121 = vminps_avx(auVar121,auVar74);
          auVar73._8_4_ = 0xc2b0c0a5;
          auVar73._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar73._12_4_ = 0xc2b0c0a5;
          auVar73._16_4_ = 0xc2b0c0a5;
          auVar73._20_4_ = 0xc2b0c0a5;
          auVar73._24_4_ = 0xc2b0c0a5;
          auVar73._28_4_ = 0xc2b0c0a5;
          auVar117 = vmaxps_avx(auVar121,auVar73);
          auVar82._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar82._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar82._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar81._8_8_ = 0x3f0000003f000000;
          auVar81._0_8_ = 0x3f0000003f000000;
          auVar81._16_8_ = 0x3f0000003f000000;
          auVar81._24_8_ = 0x3f0000003f000000;
          auVar9 = vfmadd213ps_fma(auVar82,auVar117,auVar81);
          auVar118 = vroundps_avx(ZEXT1632(auVar9),1);
          auVar121 = vcmpps_avx(ZEXT1632(auVar9),auVar118,1);
          auVar83._8_8_ = 0x3f8000003f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._16_8_ = 0x3f8000003f800000;
          auVar83._24_8_ = 0x3f8000003f800000;
          auVar121 = vpand_avx2(auVar121,auVar83);
          auVar121 = vsubps_avx(auVar118,auVar121);
          auVar84._8_8_ = 0x3f3180003f318000;
          auVar84._0_8_ = 0x3f3180003f318000;
          auVar84._16_8_ = 0x3f3180003f318000;
          auVar84._24_8_ = 0x3f3180003f318000;
          auVar9 = vfnmadd213ps_fma(auVar84,auVar121,auVar117);
          auVar85._8_8_ = 0xb95e8083b95e8083;
          auVar85._0_8_ = 0xb95e8083b95e8083;
          auVar85._16_8_ = 0xb95e8083b95e8083;
          auVar85._24_8_ = 0xb95e8083b95e8083;
          auVar11 = vfnmadd213ps_fma(auVar85,auVar121,ZEXT1632(auVar9));
          local_17c0 = auVar11._0_4_;
          fStack_17bc = auVar11._4_4_;
          fStack_17b8 = auVar11._8_4_;
          fStack_17b4 = auVar11._12_4_;
          _local_1940 = CONCAT412(fStack_17b4 * fStack_17b4,
                                  CONCAT48(fStack_17b8 * fStack_17b8,
                                           CONCAT44(fStack_17bc * fStack_17bc,
                                                    local_17c0 * local_17c0)));
          local_19e0._8_4_ = 0x39506967;
          local_19e0._0_8_ = 0x3950696739506967;
          local_19e0._12_4_ = 0x39506967;
          uStack_19d0._0_4_ = 0x39506967;
          uStack_19d0._4_4_ = 0x39506967;
          uStack_19c8._0_4_ = 0x39506967;
          uStack_19c8._4_4_ = 0x39506967;
          auVar117 = _local_19e0;
          uStack_19c8 = auVar117._24_8_;
          auVar80._16_8_ = uStack_19d0;
          auVar80._0_16_ = local_19e0;
          auVar80._24_8_ = uStack_19c8;
          auVar79._8_8_ = 0x3ab743ce3ab743ce;
          auVar79._0_8_ = 0x3ab743ce3ab743ce;
          auVar79._16_8_ = 0x3ab743ce3ab743ce;
          auVar79._24_8_ = 0x3ab743ce3ab743ce;
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar80,auVar79);
          auVar78._8_8_ = 0x3c0889083c088908;
          auVar78._0_8_ = 0x3c0889083c088908;
          auVar78._16_8_ = 0x3c0889083c088908;
          auVar78._24_8_ = 0x3c0889083c088908;
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar9),auVar78);
          auVar77._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar77._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar77._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar77._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar9),auVar77);
          auVar76._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar76._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar76._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar9),auVar76);
          auVar75._8_8_ = 0x3f0000003f000000;
          auVar75._0_8_ = 0x3f0000003f000000;
          auVar75._16_8_ = 0x3f0000003f000000;
          auVar75._24_8_ = 0x3f0000003f000000;
          auVar9 = vfmadd213ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar9),auVar75);
          auVar9 = vfmadd213ps_fma(ZEXT1632(_local_1940),ZEXT1632(auVar9),ZEXT1632(auVar11));
          local_1840 = auVar9._0_4_;
          fStack_183c = auVar9._4_4_;
          fStack_1838 = auVar9._8_4_;
          fStack_1834 = auVar9._12_4_;
          local_10e0 = auVar121._0_4_;
          fStack_10dc = auVar121._4_4_;
          fStack_10d8 = auVar121._8_4_;
          fStack_10d4 = auVar121._12_4_;
          fStack_10d0 = auVar121._16_4_;
          fStack_10cc = auVar121._20_4_;
          fStack_10c8 = auVar121._24_4_;
          fStack_10c4 = auVar121._28_4_;
          local_1980._4_4_ = (int)fStack_10dc;
          local_1980._0_4_ = (int)local_10e0;
          local_1980._8_4_ = (int)fStack_10d8;
          local_1980._12_4_ = (int)fStack_10d4;
          uStack_1970._0_4_ = (int)fStack_10d0;
          uStack_1970._4_4_ = (int)fStack_10cc;
          uStack_1968._0_4_ = (int)fStack_10c8;
          uStack_1968._4_4_ = (int)fStack_10c4;
          auVar121 = _local_1980;
          uStack_1968 = auVar121._24_8_;
          auVar87._16_8_ = uStack_1970;
          auVar87._0_16_ = local_1980;
          auVar87._24_8_ = uStack_1968;
          auVar86._8_8_ = 0x7f0000007f;
          auVar86._0_8_ = 0x7f0000007f;
          auVar86._16_8_ = 0x7f0000007f;
          auVar86._24_8_ = 0x7f0000007f;
          auVar121 = vpaddd_avx2(auVar87,auVar86);
          auVar121 = vpslld_avx2(auVar121,ZEXT416(0x17));
          local_1820 = auVar121._0_4_;
          fStack_181c = auVar121._4_4_;
          fStack_1818 = auVar121._8_4_;
          fStack_1814 = auVar121._12_4_;
          fStack_1810 = auVar121._16_4_;
          fStack_180c = auVar121._20_4_;
          fStack_1808 = auVar121._24_4_;
          auVar72._16_4_ = fStack_1bf0;
          auVar72._0_16_ = auVar8;
          auVar72._20_4_ = fStack_1bec;
          auVar72._24_4_ = fStack_1be8;
          auVar72._28_4_ = fStack_1be4;
          auVar71._4_4_ = fStack_1bfc + (fStack_183c + 1.0) * fStack_181c;
          auVar71._0_4_ = local_1c00 + (local_1840 + 1.0) * local_1820;
          auVar71._8_4_ = fStack_1bf8 + (fStack_1838 + 1.0) * fStack_1818;
          auVar71._12_4_ = fStack_1bf4 + (fStack_1834 + 1.0) * fStack_1814;
          auVar71._16_4_ = fStack_1bf0 + fStack_1810 * 1.0;
          auVar71._20_4_ = fStack_1bec + fStack_180c * 1.0;
          auVar71._24_4_ = fStack_1be8 + fStack_1808 * 1.0;
          auVar71._28_4_ = fStack_1be4 + 1.0;
          auVar121 = vrcpps_avx(auVar71);
          auVar12._4_4_ = fStack_1bfc * auVar121._4_4_;
          auVar12._0_4_ = local_1c00 * auVar121._0_4_;
          auVar12._8_4_ = fStack_1bf8 * auVar121._8_4_;
          auVar12._12_4_ = fStack_1bf4 * auVar121._12_4_;
          auVar12._16_4_ = fStack_1bf0 * auVar121._16_4_;
          auVar12._20_4_ = fStack_1bec * auVar121._20_4_;
          auVar12._24_4_ = fStack_1be8 * auVar121._24_4_;
          auVar12._28_4_ = fStack_1be4;
          auVar8 = vfmsub213ps_fma(auVar12,auVar71,auVar72);
          auVar8 = vfnmadd213ps_fma(ZEXT1632(auVar8),auVar121,auVar12);
          auVar107._16_8_ = uStack_1a70;
          auVar107._0_16_ = auVar7;
          auVar107._24_8_ = uStack_1a68;
          auVar106._16_8_ = uStack_1ab0;
          auVar106._0_16_ = auVar10;
          auVar106._24_8_ = uStack_1aa8;
          auVar123._8_4_ = 0x80000000;
          auVar123._0_8_ = 0x8000000080000000;
          auVar123._12_4_ = 0x80000000;
          auVar123._16_4_ = 0x80000000;
          auVar123._20_4_ = 0x80000000;
          auVar123._24_4_ = 0x80000000;
          auVar123._28_4_ = 0x80000000;
          auVar10 = vfmadd213ps_fma(auVar107,ZEXT1632(auVar8),auVar106 ^ auVar123);
          uStack_35c4 = (undefined4)((ulong)uStack_4ac8 >> 0x20);
          local_3600 = auVar10._0_4_;
          fStack_35fc = auVar10._4_4_;
          fStack_35f8 = auVar10._8_4_;
          fStack_35f4 = auVar10._12_4_;
          local_3c00._4_4_ = fStack_35dc * fStack_35fc;
          local_3c00._0_4_ = local_35e0 * local_3600;
          uStack_3bf8._0_4_ = fStack_35d8 * fStack_35f8;
          uStack_3bf8._4_4_ = fStack_35d4 * fStack_35f4;
          uStack_3bf0._0_4_ = fStack_35d0 * 0.0;
          uStack_3bf0._4_4_ = fStack_35cc * 0.0;
          uStack_3be8._0_4_ = fStack_35c8 * 0.0;
          uStack_3be8._4_4_ = uStack_35c4;
          break;
        case 6:
          uVar3 = *(uint *)*plVar13;
          auVar10 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar3),0x30);
          auVar7 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x30);
          uStack_34b0 = auVar7._0_8_;
          uStack_34a8 = auVar7._8_8_;
          uVar3 = *(uint *)(*plVar13 + 4);
          auVar7 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar3),0x30);
          auVar8 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar3),0x30);
          uStack_3470 = auVar8._0_8_;
          uStack_3468 = auVar8._8_8_;
          auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
          uStack_3570 = auVar9._0_8_;
          uStack_3568 = auVar9._8_8_;
          auVar59._8_8_ = uStack_4ad8;
          auVar59._0_8_ = local_4ae0;
          auVar59._16_8_ = uStack_4ad0;
          auVar59._24_8_ = uStack_4ac8;
          auVar58._16_8_ = uStack_34b0;
          auVar58._0_16_ = auVar10;
          auVar58._24_8_ = uStack_34a8;
          auVar57._16_8_ = uStack_3470;
          auVar57._0_16_ = auVar7;
          auVar57._24_8_ = uStack_3468;
          auVar10 = vfmadd213ps_fma(auVar58,auVar59,auVar57);
          auVar121 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(ZEXT816(0)));
          auVar32._16_8_ = uStack_3570;
          auVar32._0_16_ = auVar8;
          auVar32._24_8_ = uStack_3568;
          auVar121 = vminps_avx(auVar121,auVar32);
          local_3620 = auVar121._0_4_;
          fStack_361c = auVar121._4_4_;
          fStack_3618 = auVar121._8_4_;
          fStack_3614 = auVar121._12_4_;
          fStack_3610 = auVar121._16_4_;
          fStack_360c = auVar121._20_4_;
          fStack_3608 = auVar121._24_4_;
          uStack_3604 = auVar121._28_4_;
          local_3c00._4_4_ = fStack_361c * fStack_35dc;
          local_3c00._0_4_ = local_3620 * local_35e0;
          uStack_3bf8._0_4_ = fStack_3618 * fStack_35d8;
          uStack_3bf8._4_4_ = fStack_3614 * fStack_35d4;
          uStack_3bf0._0_4_ = fStack_3610 * fStack_35d0;
          uStack_3bf0._4_4_ = fStack_360c * fStack_35cc;
          uStack_3be8._0_4_ = fStack_3608 * fStack_35c8;
          uStack_3be8._4_4_ = uStack_3604;
          break;
        default:
          uStack_3bf8 = uStack_4ad8;
          local_3c00 = (undefined1  [8])local_4ae0;
          uStack_3bf0 = uStack_4ad0;
          uStack_3be8 = uStack_4ac8;
        }
        *local_4a38 = _local_3c00;
        local_4a38 = local_4a38 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to8_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = (y * kernel_w + x) * 128;

                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
                            __m256 _val8 = _mm256_broadcast_ss(sptr + 8);
                            __m256 _val9 = _mm256_broadcast_ss(sptr + 9);
                            __m256 _vala = _mm256_broadcast_ss(sptr + 10);
                            __m256 _valb = _mm256_broadcast_ss(sptr + 11);
                            __m256 _valc = _mm256_broadcast_ss(sptr + 12);
                            __m256 _vald = _mm256_broadcast_ss(sptr + 13);
                            __m256 _vale = _mm256_broadcast_ss(sptr + 14);
                            __m256 _valf = _mm256_broadcast_ss(sptr + 15);
                            __m256 _w0 = _mm256_load_ps(kptr + k);
                            __m256 _w1 = _mm256_load_ps(kptr + k + 8);
                            __m256 _w2 = _mm256_load_ps(kptr + k + 8 * 2);
                            __m256 _w3 = _mm256_load_ps(kptr + k + 8 * 3);
                            __m256 _w4 = _mm256_load_ps(kptr + k + 8 * 4);
                            __m256 _w5 = _mm256_load_ps(kptr + k + 8 * 5);
                            __m256 _w6 = _mm256_load_ps(kptr + k + 8 * 6);
                            __m256 _w7 = _mm256_load_ps(kptr + k + 8 * 7);
                            __m256 _w8 = _mm256_load_ps(kptr + k + 8 * 8);
                            __m256 _w9 = _mm256_load_ps(kptr + k + 8 * 9);
                            __m256 _wa = _mm256_load_ps(kptr + k + 8 * 10);
                            __m256 _wb = _mm256_load_ps(kptr + k + 8 * 11);
                            __m256 _wc = _mm256_load_ps(kptr + k + 8 * 12);
                            __m256 _wd = _mm256_load_ps(kptr + k + 8 * 13);
                            __m256 _we = _mm256_load_ps(kptr + k + 8 * 14);
                            __m256 _wf = _mm256_load_ps(kptr + k + 8 * 15);
                            _sum = _mm256_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm256_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm256_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm256_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm256_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm256_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm256_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm256_fmadd_ps(_val7, _w7, _sum);
                            _sum = _mm256_fmadd_ps(_val8, _w8, _sum);
                            _sum = _mm256_fmadd_ps(_val9, _w9, _sum);
                            _sum = _mm256_fmadd_ps(_vala, _wa, _sum);
                            _sum = _mm256_fmadd_ps(_valb, _wb, _sum);
                            _sum = _mm256_fmadd_ps(_valc, _wc, _sum);
                            _sum = _mm256_fmadd_ps(_vald, _wd, _sum);
                            _sum = _mm256_fmadd_ps(_vale, _we, _sum);
                            _sum = _mm256_fmadd_ps(_valf, _wf, _sum);
                        }
                    }

                    kptr += maxk * 128;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}